

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_cwksp.h
# Opt level: O2

void ZSTD_cwksp_clear(ZSTD_cwksp *ws)

{
  void *pvVar1;
  
  ws->tableEnd = ws->objectEnd;
  ws->allocStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
  ws->allocFailed = '\0';
  if (ZSTD_cwksp_alloc_aligned_init_once < ws->phase) {
    ws->phase = ZSTD_cwksp_alloc_aligned_init_once;
    ZSTD_cwksp_assert_internal_consistency(ws);
    return;
  }
  pvVar1 = ws->objectEnd;
  if (pvVar1 < ws->workspace) {
    __assert_fail("ws->workspace <= ws->objectEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                  ,0xb7,"void ZSTD_cwksp_assert_internal_consistency(ZSTD_cwksp *)");
  }
  if (ws->tableEnd < pvVar1) {
    __assert_fail("ws->objectEnd <= ws->tableEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                  ,0xb8,"void ZSTD_cwksp_assert_internal_consistency(ZSTD_cwksp *)");
  }
  if (ws->tableValidEnd < pvVar1) {
    __assert_fail("ws->objectEnd <= ws->tableValidEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                  ,0xb9,"void ZSTD_cwksp_assert_internal_consistency(ZSTD_cwksp *)");
  }
  pvVar1 = ws->allocStart;
  if (pvVar1 < ws->tableEnd) {
    __assert_fail("ws->tableEnd <= ws->allocStart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                  ,0xba,"void ZSTD_cwksp_assert_internal_consistency(ZSTD_cwksp *)");
  }
  if (pvVar1 < ws->tableValidEnd) {
    __assert_fail("ws->tableValidEnd <= ws->allocStart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                  ,0xbb,"void ZSTD_cwksp_assert_internal_consistency(ZSTD_cwksp *)");
  }
  if (ws->workspaceEnd < pvVar1) {
    __assert_fail("ws->allocStart <= ws->workspaceEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                  ,0xbc,"void ZSTD_cwksp_assert_internal_consistency(ZSTD_cwksp *)");
  }
  if (ws->initOnceStart <= (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0)) {
    if (ws->workspace <= ws->initOnceStart) {
      return;
    }
    __assert_fail("ws->workspace <= ws->initOnceStart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                  ,0xbe,"void ZSTD_cwksp_assert_internal_consistency(ZSTD_cwksp *)");
  }
  __assert_fail("ws->initOnceStart <= ZSTD_cwksp_initialAllocStart(ws)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                ,0xbd,"void ZSTD_cwksp_assert_internal_consistency(ZSTD_cwksp *)");
}

Assistant:

MEM_STATIC void ZSTD_cwksp_clear(ZSTD_cwksp* ws) {
    DEBUGLOG(4, "cwksp: clearing!");

#if ZSTD_MEMORY_SANITIZER && !defined (ZSTD_MSAN_DONT_POISON_WORKSPACE)
    /* To validate that the context re-use logic is sound, and that we don't
     * access stuff that this compression hasn't initialized, we re-"poison"
     * the workspace except for the areas in which we expect memory re-use
     * without initialization (objects, valid tables area and init once
     * memory). */
    {
        if((BYTE*)ws->tableValidEnd < (BYTE*)ws->initOnceStart) {
            size_t size = (BYTE*)ws->initOnceStart - (BYTE*)ws->tableValidEnd;
            __msan_poison(ws->tableValidEnd, size);
        }
    }
#endif

#if ZSTD_ADDRESS_SANITIZER && !defined (ZSTD_ASAN_DONT_POISON_WORKSPACE)
    /* We don't do this when the workspace is statically allocated, because
     * when that is the case, we have no capability to hook into the end of the
     * workspace's lifecycle to unpoison the memory.
     */
    if (ws->isStatic == ZSTD_cwksp_dynamic_alloc) {
        size_t size = (BYTE*)ws->workspaceEnd - (BYTE*)ws->objectEnd;
        __asan_poison_memory_region(ws->objectEnd, size);
    }
#endif

    ws->tableEnd = ws->objectEnd;
    ws->allocStart = ZSTD_cwksp_initialAllocStart(ws);
    ws->allocFailed = 0;
    if (ws->phase > ZSTD_cwksp_alloc_aligned_init_once) {
        ws->phase = ZSTD_cwksp_alloc_aligned_init_once;
    }
    ZSTD_cwksp_assert_internal_consistency(ws);
}